

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int trico_read_vec3_float(void *a,float **vertices,trico_stream_type st)

{
  uint32_t *__src;
  uint *puVar1;
  uint32_t nr_of_vertices;
  long lVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint *puVar5;
  uint8_t *puVar6;
  uint64_t sz;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint32_t nr_of_floats_z;
  uint32_t nr_of_floats_y;
  uint32_t nr_of_floats_x;
  float *decompressed_z;
  float *decompressed_y;
  float *decompressed_x;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t local_54;
  float *local_50;
  float *local_48;
  float *local_40;
  float **local_38;
  
  iVar8 = 0;
  iVar9 = 0;
  if ((*(trico_stream_type *)((long)a + 0x24) == st) &&
     (iVar9 = iVar8, *(int *)((long)a + 0x40) == 0)) {
    lVar2 = *(long *)((long)a + 0x10);
    puVar3 = *(uint32_t **)((long)a + 0x18);
    uVar4 = *(ulong *)((long)a + 0x30);
    if ((ulong)((long)puVar3 + (4 - lVar2)) <= uVar4) {
      nr_of_vertices = *puVar3;
      *(uint32_t **)((long)a + 0x18) = puVar3 + 1;
      if ((ulong)((long)(puVar3 + 1) + (4 - lVar2)) <= uVar4) {
        uVar7 = (ulong)puVar3[1];
        __src = puVar3 + 2;
        *(uint32_t **)((long)a + 0x18) = __src;
        local_38 = vertices;
        puVar6 = (uint8_t *)malloc(uVar7);
        if ((long)puVar3 + ((uVar7 + 8) - lVar2) <= uVar4) {
          memcpy(puVar6,__src,uVar7);
          *(ulong *)((long)a + 0x18) = (long)__src + uVar7;
          trico_decompress(&local_54,&local_40,puVar6);
          iVar9 = 0;
          if (*(int *)((long)a + 0x40) == 0) {
            lVar2 = *(long *)((long)a + 0x10);
            puVar5 = *(uint **)((long)a + 0x18);
            uVar4 = *(ulong *)((long)a + 0x30);
            if ((ulong)((long)puVar5 + (4 - lVar2)) <= uVar4) {
              uVar7 = (ulong)*puVar5;
              puVar1 = puVar5 + 1;
              *(uint **)((long)a + 0x18) = puVar1;
              puVar6 = (uint8_t *)realloc(puVar6,uVar7);
              if ((long)puVar5 + ((uVar7 + 4) - lVar2) <= uVar4) {
                memcpy(puVar6,puVar1,uVar7);
                *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                trico_decompress(&local_58,&local_48,puVar6);
                iVar9 = 0;
                if (*(int *)((long)a + 0x40) == 0) {
                  lVar2 = *(long *)((long)a + 0x10);
                  puVar5 = *(uint **)((long)a + 0x18);
                  uVar4 = *(ulong *)((long)a + 0x30);
                  if ((ulong)((long)puVar5 + (4 - lVar2)) <= uVar4) {
                    uVar7 = (ulong)*puVar5;
                    puVar1 = puVar5 + 1;
                    *(uint **)((long)a + 0x18) = puVar1;
                    puVar6 = (uint8_t *)realloc(puVar6,uVar7);
                    if ((long)puVar5 + ((uVar7 + 4) - lVar2) <= uVar4) {
                      memcpy(puVar6,puVar1,uVar7);
                      *(ulong *)((long)a + 0x18) = (long)puVar1 + uVar7;
                      trico_decompress(&local_5c,&local_50,puVar6);
                      free(puVar6);
                      if (local_54 != nr_of_vertices) {
                        __assert_fail("nr_of_floats_x == nr_vertices",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x3d6,
                                      "int trico_read_vec3_float(void *, float **, enum trico_stream_type)"
                                     );
                      }
                      if (nr_of_vertices != local_58) {
                        __assert_fail("nr_of_floats_x == nr_of_floats_y",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x3d7,
                                      "int trico_read_vec3_float(void *, float **, enum trico_stream_type)"
                                     );
                      }
                      if (nr_of_vertices != local_5c) {
                        __assert_fail("nr_of_floats_x == nr_of_floats_z",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                                      ,0x3d8,
                                      "int trico_read_vec3_float(void *, float **, enum trico_stream_type)"
                                     );
                      }
                      if (local_38 != (float **)0x0) {
                        trico_transpose_xyz_soa_to_aos
                                  (local_38,local_40,local_48,local_50,nr_of_vertices);
                      }
                      free(local_40);
                      free(local_48);
                      free(local_50);
                      read_next_stream_type((trico_archive *)a);
                      iVar9 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar9;
}

Assistant:

static int trico_read_vec3_float(void* a, float** vertices, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_vertices;
  if (!read(&nr_vertices, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_x;
  uint32_t nr_of_floats_x;
  trico_decompress(&nr_of_floats_x, &decompressed_x, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_y;
  uint32_t nr_of_floats_y;
  trico_decompress(&nr_of_floats_y, &decompressed_y, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  float* decompressed_z;
  uint32_t nr_of_floats_z;
  trico_decompress(&nr_of_floats_z, &decompressed_z, (const uint8_t*)compressed);
  trico_free(compressed);

  assert(nr_of_floats_x == nr_vertices);
  assert(nr_of_floats_x == nr_of_floats_y);
  assert(nr_of_floats_x == nr_of_floats_z);

  if (vertices != NULL)
    trico_transpose_xyz_soa_to_aos(vertices, decompressed_x, decompressed_y, decompressed_z, nr_vertices);

  trico_free(decompressed_x);
  trico_free(decompressed_y);
  trico_free(decompressed_z);

  read_next_stream_type(arch);

  return 1;
  }